

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool.c
# Opt level: O0

void * pool_buffer_iter(chck_pool_buffer *pb,size_t *iter,_Bool reverse)

{
  int iVar1;
  void *ptr;
  _Bool reverse_local;
  size_t *iter_local;
  chck_pool_buffer *pb_local;
  
  if ((pb != (chck_pool_buffer *)0x0) && (iter != (size_t *)0x0)) {
    if ((pb->member == 0) || (pb->used / pb->member <= *iter)) {
      pb_local = (chck_pool_buffer *)0x0;
    }
    else {
      pb_local = (chck_pool_buffer *)pool_buffer_get(pb,*iter);
      iVar1 = 1;
      if (reverse) {
        iVar1 = -1;
      }
      *iter = (long)iVar1 + *iter;
    }
    return pb_local;
  }
  __assert_fail("pb && iter",
                "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/pool/pool.c",
                0xd4,"void *pool_buffer_iter(const struct chck_pool_buffer *, size_t *, _Bool)");
}

Assistant:

static void*
pool_buffer_iter(const struct chck_pool_buffer *pb, size_t *iter, bool reverse)
{
   assert(pb && iter);

   if (!pb->member || *iter >= pb->used / pb->member)
      return NULL;

   void *ptr = pool_buffer_get(pb, *iter);
   (*iter) += (reverse ? -1 : 1);
   return ptr;
}